

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

optional<Range> * __thiscall
TextBuffer::Layer::find_in_range
          (optional<Range> *__return_storage_ptr__,Layer *this,Regex *regex,Range range,bool splay)

{
  anon_class_8_1_6971b95b local_38;
  
  optional<Range>::optional(__return_storage_ptr__);
  local_38.result = __return_storage_ptr__;
  scan_in_range<TextBuffer::Layer::find_in_range(Regex_const&,Range,bool)::_lambda(Range)_1_>
            (this,regex,range,&local_38,splay);
  return __return_storage_ptr__;
}

Assistant:

optional<Range> find_in_range(const Regex &regex, Range range, bool splay = false) {
    optional<Range> result;
    scan_in_range(regex, range, [&result](Range match_range) -> bool {
      result = match_range;
      return true;
    }, splay);
    return result;
  }